

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_LAVA_POOL(effect_handler_context_t *context)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  loc_conflict grid1;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc grid;
  
  wVar1 = context->radius;
  iVar2 = (player->grid).x;
  iVar3 = (player->grid).y;
  grid1 = player->grid;
  for (wVar7 = iVar3 - wVar1; wVar6 = iVar2 - wVar1, wVar7 <= iVar3 + wVar1; wVar7 = wVar7 + L'\x01'
      ) {
    for (; wVar6 <= iVar2 + wVar1; wVar6 = wVar6 + L'\x01') {
      grid.y = wVar7;
      grid.x = wVar6;
      wVar5 = distance(grid1,(loc_conflict)grid);
      if ((((wVar5 <= wVar1) && (_Var4 = square_in_bounds_fully(cave,grid), _Var4)) &&
          (_Var4 = square_ispermanent(cave,grid), !_Var4)) &&
         (_Var4 = square_isvault(cave,grid), !_Var4)) {
        square_set_feat(cave,grid,FEAT_LAVA);
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_LAVA_POOL(effect_handler_context_t *context)
{
	int r = context->radius;
	struct loc grid, pgrid = player->grid;

	/* Everything in range */
	for (grid.y = pgrid.y - r; grid.y <= pgrid.y + r; grid.y++) {
		for (grid.x = pgrid.x - r; grid.x <= pgrid.x + r; grid.x++) {
			int dist = distance(pgrid, grid);

			/* Skip distant grids */
			if (dist > r) continue;

			/* Skip grids that are out of bounds */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip grids that are permanent */
			if (square_ispermanent(cave, grid)) continue;

			/* Skip grids in vaults */
			if (square_isvault(cave, grid)) continue;

			/* Lava now */
			square_set_feat(cave, grid, FEAT_LAVA);
		}
	}
	return true;
}